

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_sqaddi_b_aarch64(void *d,void *a,int32_t b,uint32_t desc)

{
  intptr_t iVar1;
  undefined4 local_34;
  int r;
  intptr_t oprsz;
  intptr_t i;
  uint32_t desc_local;
  int32_t b_local;
  void *a_local;
  void *d_local;
  
  iVar1 = simd_oprsz(desc);
  for (oprsz = 0; oprsz < iVar1; oprsz = oprsz + 1) {
    local_34 = *(char *)((long)a + oprsz) + b;
    if (local_34 < 0x80) {
      if (local_34 < -0x80) {
        local_34 = -0x80;
      }
    }
    else {
      local_34._0_1_ = 0x7f;
    }
    *(undefined1 *)((long)d + oprsz) = (undefined1)local_34;
  }
  return;
}

Assistant:

void HELPER(sve_sqaddi_b)(void *d, void *a, int32_t b, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);

    for (i = 0; i < oprsz; i += sizeof(int8_t)) {
        int r = *(int8_t *)((char *)a + i) + b;
        if (r > INT8_MAX) {
            r = INT8_MAX;
        } else if (r < INT8_MIN) {
            r = INT8_MIN;
        }
        *(int8_t *)((char *)d + i) = r;
    }
}